

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O3

void __thiscall ui::AboutImpl::AboutImpl(AboutImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  Ref<ftxui::ButtonOption> option;
  Component local_98;
  ConstStringRef local_88;
  code *local_60;
  _Any_data local_58;
  undefined1 local_48;
  undefined7 uStack_47;
  string *local_38;
  
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.parent_ = (ComponentBase *)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__AboutImpl_00173640;
  (this->title_)._M_dataplus._M_p = (pointer)&(this->title_).field_2;
  (this->title_)._M_string_length = 0;
  (this->title_).field_2._M_local_buf[0] = '\0';
  this->view_logo = false;
  (this->button_text)._M_dataplus._M_p = (pointer)&(this->button_text).field_2;
  (this->button_text)._M_string_length = 0;
  (this->button_text).field_2._M_local_buf[0] = '\0';
  (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->opt).border = false;
  std::__cxx11::string::_M_replace((ulong)&this->button_text,0,(char *)0x0,0x157dee);
  local_58._8_8_ = 0;
  local_48 = 0;
  local_88.owned_.field_2._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/about/about_impl.cpp:52:9)>
             ::_M_invoke;
  local_88.address_ =
       (string *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/about/about_impl.cpp:52:9)>
       ::_M_manager;
  option.address_._0_4_ = *(undefined4 *)&this->opt;
  option._0_8_ = &local_88.owned_.field_2;
  option.address_._4_4_ = 0;
  local_88.owned_.field_2._M_allocated_capacity = (size_type)this;
  local_58._M_unused._M_object = &local_48;
  local_38 = &this->button_text;
  ftxui::Button(&local_88,(function<void_()> *)&local_58,option);
  sVar3 = local_88.owned_._M_string_length;
  _Var2._M_p = local_88.owned_._M_dataplus._M_p;
  local_88.owned_._M_dataplus._M_p = (pointer)0x0;
  local_88.owned_._M_string_length = 0;
  this_00 = (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var2._M_p;
  (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.owned_._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.owned_._M_string_length);
    }
  }
  if (local_88.address_ != (string *)0x0) {
    paVar1 = &local_88.owned_.field_2;
    (*(code *)local_88.address_)(paVar1,paVar1,3);
  }
  if ((undefined1 *)local_58._M_unused._0_8_ != &local_48) {
    operator_delete(local_58._M_unused._M_object,CONCAT71(uStack_47,local_48) + 1);
  }
  local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ftxui::ComponentBase::Add((ComponentBase *)this,&local_98);
  if (local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

AboutImpl() {
    opt.border = false;
    button_text = "View Logo";
    viewLogo = Button(
        &button_text,
        [&] {
          view_logo = !view_logo;
          if (view_logo) {
            button_text = "Go Back";
          } else {
            button_text = "View Logo";
          }
        },
        opt);
    Add(viewLogo);
  }